

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void lodepng_info_cleanup(LodePNGInfo *info)

{
  uchar *__ptr;
  uint i;
  long lVar1;
  
  __ptr = (info->color).palette;
  if (__ptr != (uchar *)0x0) {
    free(__ptr);
  }
  (info->color).palette = (uchar *)0x0;
  (info->color).palettesize = 0;
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);
  free(info->iccp_name);
  lVar1 = 0;
  info->iccp_name = (char *)0x0;
  free(info->iccp_profile);
  info->iccp_profile = (uchar *)0x0;
  info->iccp_profile_size = 0;
  info->iccp_defined = 0;
  do {
    free(info->unknown_chunks_data[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void lodepng_info_cleanup(LodePNGInfo* info) {
  lodepng_color_mode_cleanup(&info->color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);

  lodepng_clear_icc(info);

  LodePNGUnknownChunks_cleanup(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}